

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

void __thiscall hwnet::Epoll::Enable(Epoll *this,Ptr *channel,int flag)

{
  element_type *peVar1;
  int __fd;
  int iVar2;
  epoll_event local_30;
  
  peVar1 = (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30._4_4_ = SUB84(peVar1,0);
  local_30.data.fd = (int)((ulong)peVar1 >> 0x20);
  local_30.events = flag & 4U | (uint)flag >> 1 & 1 | peVar1->events;
  iVar2 = this->epfd;
  __fd = (*peVar1->_vptr_Channel[1])(peVar1);
  iVar2 = epoll_ctl(iVar2,3,__fd,&local_30);
  if (iVar2 == 0) {
    ((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events =
         local_30.events;
  }
  return;
}

Assistant:

void Epoll::Enable(const Channel::Ptr &channel,int flag) {

	epoll_event ev = {0};
	ev.data.ptr = channel.get();
	ev.events = channel->events;
		
	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_MOD,channel->Fd(),&ev)) {
		channel->events = ev.events;
	}

}